

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall
SubprocessTestInterruptChild::SubprocessTestInterruptChild(SubprocessTestInterruptChild *this)

{
  anon_unknown.dwarf_101077::SubprocessTest::SubprocessTest(&this->super_SubprocessTest);
  (this->super_SubprocessTest).super_Test._vptr_Test = (_func_int **)&PTR__SubprocessTest_001e5dc8;
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChild) {
  Subprocess* subproc = subprocs_.Add("kill -INT $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}